

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  Column *pCVar5;
  size_type sVar6;
  ostream *poVar7;
  allocator<char> local_231;
  string local_230;
  pluralise local_210;
  allocator<char> local_1e1;
  string local_1e0;
  pluralise local_1c0;
  string local_198;
  Column local_178;
  Column local_148;
  undefined1 local_118 [8];
  string description;
  Column local_d8;
  Column local_a8;
  Colour local_75;
  Code local_74;
  Colour colourGuard;
  reference pTStack_70;
  Code colour;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  undefined1 local_28 [8];
  TestSpec testSpec;
  Config *config_local;
  
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xc])();
  TestSpec::TestSpec((TestSpec *)local_28,(TestSpec *)CONCAT44(extraout_var,iVar3));
  bVar1 = (*(code *)((testSpec.m_filters.
                      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                    super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)();
  if ((bVar1 & 1) == 0) {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"All available test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"Matching test cases:\n");
  }
  testCases = getAllTestCasesSorted
                        ((IConfig *)
                         testSpec.m_filters.
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1,testCases,
              (TestSpec *)local_28,
              (IConfig *)
              testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  testCaseInfo = (TestCase *)
                 clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  while (bVar2 = __gnu_cxx::
                 operator==<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                           (&__end1,(__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                     *)&testCaseInfo), ((bVar2 ^ 0xffU) & 1) != 0) {
    pTStack_70 = __gnu_cxx::
                 __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*(&__end1);
    bVar2 = TestCaseInfo::isHidden(&pTStack_70->super_TestCaseInfo);
    local_74 = None;
    if (bVar2) {
      local_74 = FileName;
    }
    Colour::Colour(&local_75,local_74);
    poVar4 = cout();
    clara::TextFlow::Column::Column(&local_a8,(string *)pTStack_70);
    pCVar5 = clara::TextFlow::Column::initialIndent(&local_a8,2);
    pCVar5 = clara::TextFlow::Column::indent(pCVar5,4);
    poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
    std::operator<<((ostream *)poVar4,"\n");
    clara::TextFlow::Column::~Column(&local_a8);
    iVar3 = (*(code *)((testSpec.m_filters.
                        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                      super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[9].
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
    if (1 < iVar3) {
      poVar4 = cout();
      Detail::stringify<Catch::SourceLineInfo>
                ((string *)((long)&description.field_2 + 8),
                 &(pTStack_70->super_TestCaseInfo).lineInfo);
      clara::TextFlow::Column::Column(&local_d8,(string *)((long)&description.field_2 + 8));
      pCVar5 = clara::TextFlow::Column::indent(&local_d8,4);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column(&local_d8);
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)local_118,&(pTStack_70->super_TestCaseInfo).description);
      bVar2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118
                     );
      if (bVar2) {
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                  "(NO DESCRIPTION)");
      }
      poVar4 = cout();
      clara::TextFlow::Column::Column(&local_148,(string *)local_118);
      pCVar5 = clara::TextFlow::Column::indent(&local_148,4);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column(&local_148);
      std::__cxx11::string::~string((string *)local_118);
    }
    bVar2 = clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(pTStack_70->super_TestCaseInfo).tags);
    if (!bVar2) {
      poVar4 = cout();
      TestCaseInfo::tagsAsString_abi_cxx11_(&local_198,&pTStack_70->super_TestCaseInfo);
      clara::TextFlow::Column::Column(&local_178,&local_198);
      pCVar5 = clara::TextFlow::Column::indent(&local_178,6);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::operator<<((ostream *)poVar4,"\n");
      clara::TextFlow::Column::~Column(&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
    Colour::~Colour(&local_75);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  bVar1 = (*(code *)((testSpec.m_filters.
                      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                    super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)();
  if ((bVar1 & 1) == 0) {
    poVar4 = cout();
    sVar6 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                      ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"test case",&local_1e1);
    pluralise::pluralise(&local_1c0,sVar6,&local_1e0);
    poVar4 = operator<<(poVar4,&local_1c0);
    poVar7 = std::operator<<((ostream *)poVar4,'\n');
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  else {
    poVar4 = cout();
    sVar6 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                      ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"matching test case",&local_231);
    pluralise::pluralise(&local_210,sVar6,&local_230);
    poVar4 = operator<<(poVar4,&local_210);
    poVar7 = std::operator<<((ostream *)poVar4,'\n');
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  sVar6 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                    ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  TestSpec::~TestSpec((TestSpec *)local_28);
  return sVar6;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
        }

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Column( testCaseInfo.name ).initialIndent( 2 ).indent( 4 ) << "\n";
            if( config.verbosity() >= Verbosity::High ) {
                Catch::cout() << Column( Catch::Detail::stringify( testCaseInfo.lineInfo ) ).indent(4) << std::endl;
                std::string description = testCaseInfo.description;
                if( description.empty() )
                    description = "(NO DESCRIPTION)";
                Catch::cout() << Column( description ).indent(4) << std::endl;
            }
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Column( testCaseInfo.tagsAsString() ).indent( 6 ) << "\n";
        }

        if( !config.hasTestFilters() )
            Catch::cout() << pluralise( matchedTestCases.size(), "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTestCases.size(), "matching test case" ) << '\n' << std::endl;
        return matchedTestCases.size();
    }